

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Equation(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  eval_error *this_00;
  long lVar5;
  Depth_Counter dc;
  Depth_Counter local_130;
  string local_128;
  string local_108;
  File_Position local_e8;
  Static_String local_e0 [12];
  
  Depth_Counter::Depth_Counter(&local_130,this);
  puVar1 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar3 = Operator(this,0);
  if (bVar3) {
    memcpy(local_e0,&DAT_00237d38,0xc0);
    lVar5 = 0;
    do {
      bVar4 = Symbol(this,(Static_String *)((long)&local_e0[0].m_size + lVar5),true);
      if (bVar4) {
        SkipWS(this,true);
        bVar4 = Equation(this);
        if (!bVar4) {
          this_00 = (eval_error *)__cxa_allocate_exception(0x90);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_108,"Incomplete equation","");
          local_e8.line = (this->m_position).line;
          local_e8.column = (this->m_position).col;
          exception::eval_error::eval_error
                    (this_00,&local_108,&local_e8,
                     (this->m_filename).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,*(char **)((long)&local_e0[0].data + lVar5),
                   (allocator<char> *)&local_108);
        ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
        ::
        build_match<chaiscript::eval::Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                  ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                    *)this,(long)puVar1 - (long)puVar2 >> 3,&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        break;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0xc0);
  }
  (local_130.parser)->m_current_parse_depth = (local_130.parser)->m_current_parse_depth - 1;
  return bVar3;
}

Assistant:

bool Equation() {
        Depth_Counter dc{this};
        const auto prev_stack_top = m_match_stack.size();

        using SS = utility::Static_String;

        if (Operator()) {
          for (const auto &sym :
               {SS{"="}, SS{":="}, SS{"+="}, SS{"-="}, SS{"*="}, SS{"/="}, SS{"%="}, SS{"<<="}, SS{">>="}, SS{"&="}, SS{"^="}, SS{"|="}}) {
            if (Symbol(sym, true)) {
              SkipWS(true);
              if (!Equation()) {
                throw exception::eval_error("Incomplete equation", File_Position(m_position.line, m_position.col), *m_filename);
              }

              build_match<eval::Equation_AST_Node<Tracer>>(prev_stack_top, sym.c_str());
              return true;
            }
          }
          return true;
        }

        return false;
      }